

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O2

void text_subtitles::TextSubtitlesRender::addBorder
               (int borderWidth,uint8_t *data,int width,int height)

{
  long lVar1;
  int y;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  int *piVar10;
  bool bVar11;
  
  lVar1 = (long)width;
  iVar5 = 0;
  iVar6 = 0;
  if (0 < width) {
    iVar6 = width;
  }
  iVar7 = height + -1;
  if (height < 1) {
    height = 0;
  }
  if (borderWidth < 1) {
    borderWidth = 0;
  }
  for (; iVar5 != borderWidth; iVar5 = iVar5 + 1) {
    puVar9 = data;
    for (iVar2 = 0; iVar2 != height; iVar2 = iVar2 + 1) {
      puVar8 = puVar9;
      for (lVar4 = 0; iVar3 = (int)lVar4, iVar6 != iVar3; lVar4 = lVar4 + 1) {
        if ((*(int *)(puVar9 + lVar4 * 4) != 0) && (*(int *)(puVar9 + lVar4 * 4) != 0x10101)) {
          if (iVar3 != 0) {
            if (*(int *)(puVar9 + lVar4 * 4 + -4) == 0) {
              builtin_memcpy(puVar9 + lVar4 * 4 + -4,"\x01\x01\x01",4);
            }
            if ((iVar2 != 0) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * -4 + -4) == 0)) {
              builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * -4 + -4,"\x01\x01\x01",4);
            }
            if ((iVar2 < iVar7) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * 4 + -4) == 0)) {
              builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * 4 + -4,"\x01\x01\x01",4);
            }
          }
          if ((iVar2 != 0) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * -4) == 0)) {
            builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * -4,"\x01\x01\x01",4);
          }
          if ((iVar2 < iVar7) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * 4) == 0)) {
            builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * 4,"\x01\x01\x01",4);
          }
          if (iVar3 < width + -1) {
            if (*(int *)(puVar9 + lVar4 * 4 + 4) == 0) {
              builtin_memcpy(puVar9 + lVar4 * 4 + 4,"\x01\x01\x01",4);
            }
            if ((iVar2 != 0) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * -4 + 4) == 0)) {
              builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * -4 + 4,"\x01\x01\x01",4);
            }
            if ((iVar2 < iVar7) && (*(int *)(puVar9 + lVar4 * 4 + lVar1 * 4 + 4) == 0)) {
              builtin_memcpy(puVar9 + lVar4 * 4 + lVar1 * 4 + 4,"\x01\x01\x01",4);
            }
          }
        }
        puVar8 = puVar8 + 4;
      }
      puVar9 = puVar8;
    }
    piVar10 = (int *)data;
    for (iVar2 = 0; iVar3 = iVar6, iVar2 != height; iVar2 = iVar2 + 1) {
      while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
        if (*piVar10 == 0x10101) {
          *piVar10 = -0xfdfdfe;
        }
        piVar10 = piVar10 + 1;
      }
    }
  }
  return;
}

Assistant:

void TextSubtitlesRender::addBorder(const int borderWidth, uint8_t* data, const int width, const int height)
{
    // add black border
    for (int i = 0; i < borderWidth; ++i)
    {
        auto dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                if (*dst != 0 && *dst != BORDER_COLOR_TMP)
                {
                    if (x > 0)
                    {
                        setBPoint(dst - 1);
                        if (y > 0)
                            setBPoint(dst - 1 - width);
                        if (y < height - 1)
                            setBPoint(dst - 1 + width);
                    }
                    if (y > 0)
                        setBPoint(dst - width);
                    if (y < height - 1)
                        setBPoint(dst + width);
                    if (x < width - 1)
                    {
                        setBPoint(dst + 1);
                        if (y > 0)
                            setBPoint(dst + 1 - width);
                        if (y < height - 1)
                            setBPoint(dst + 1 + width);
                    }
                }
                dst++;
            }
        }
        dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
            for (int x = 0; x < width; ++x)
            {
                if (*dst == BORDER_COLOR_TMP)
                    *dst = BORDER_COLOR;
                dst++;
            }
    }
}